

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderEditor.cpp
# Opt level: O2

void __thiscall OrderEditor::addActionsToToolbar(OrderEditor *this,Actions *actions)

{
  QAction *pQVar1;
  reference ppQVar2;
  QArrayDataPointer<QAction_*> local_30;
  
  QWidget::actions();
  ppQVar2 = QList<QAction_*>::operator[]((QList<QAction_*> *)&local_30,0);
  pQVar1 = *ppQVar2;
  QArrayDataPointer<QAction_*>::~QArrayDataPointer(&local_30);
  QWidget::insertAction((QAction *)this->mToolbar,pQVar1);
  QWidget::insertAction((QAction *)this->mToolbar,pQVar1);
  QWidget::insertAction((QAction *)this->mToolbar,pQVar1);
  QToolBar::insertSeparator((QAction *)this->mToolbar);
  QWidget::insertAction((QAction *)this->mToolbar,pQVar1);
  QWidget::insertAction((QAction *)this->mToolbar,pQVar1);
  QToolBar::insertSeparator((QAction *)this->mToolbar);
  return;
}

Assistant:

void OrderEditor::addActionsToToolbar(Actions const& actions) {
    auto head = mToolbar->actions()[0];
    mToolbar->insertAction(head, actions.add);
    mToolbar->insertAction(head, actions.remove);
    mToolbar->insertAction(head, actions.duplicate);
    mToolbar->insertSeparator(head);
    mToolbar->insertAction(head, actions.moveUp);
    mToolbar->insertAction(head, actions.moveDown);
    mToolbar->insertSeparator(head);
}